

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

bool write_to_descriptor(int desc,char *txt,int length)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  int *piVar5;
  uint uVar6;
  string_view fmt;
  char *local_30;
  
  if (length < 1) {
    sVar3 = strlen(txt);
    length = (int)sVar3;
  }
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    iVar2 = length - uVar6;
    if (iVar2 == 0 || length < (int)uVar6) goto LAB_002d6a87;
    if (0xfff < iVar2) {
      iVar2 = 0x1000;
    }
    sVar4 = write(desc,txt + uVar6,(long)iVar2);
    uVar1 = uVar6 + (int)sVar4;
  } while (-1 < (int)sVar4);
  piVar5 = __errno_location();
  local_30 = strerror(*piVar5);
  fmt._M_str = "Write_to_descriptor: write: {}";
  fmt._M_len = 0x1e;
  CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt,&local_30);
LAB_002d6a87:
  return length <= (int)uVar6;
}

Assistant:

bool write_to_descriptor(int desc, char *txt, int length)
{
	int iStart;
	int nWrite;
	int nBlock;

	if (length <= 0)
		length = strlen(txt);

	for (iStart = 0; iStart < length; iStart += nWrite)
	{
		nBlock = std::min(length - iStart, 4096);
		if ((nWrite = write(desc, txt + iStart, nBlock)) < 0)
		{
			RS.Logger.Warn("Write_to_descriptor: write: {}", std::strerror(errno));
			return false;
		}
	}

	return true;
}